

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::downscaleImage<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,int factor)

{
  undefined4 uVar1;
  long lVar2;
  ulong uVar3;
  int kk_1;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  ulong uVar11;
  int iVar12;
  long i;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uchar *puVar17;
  
  if (factor < 2) {
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (uchar *)0x0;
    __return_storage_ptr__->row = (uchar **)0x0;
    __return_storage_ptr__->img = (uchar ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (__return_storage_ptr__,image->width,image->height,(long)image->depth);
    memcpy(__return_storage_ptr__->pixel,image->pixel,__return_storage_ptr__->n);
  }
  else {
    uVar5 = (ulong)(uint)factor;
    lVar9 = image->width;
    lVar13 = image->height;
    iVar4 = image->depth;
    __return_storage_ptr__->depth = 0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->pixel = (uchar *)0x0;
    __return_storage_ptr__->row = (uchar **)0x0;
    __return_storage_ptr__->img = (uchar ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (__return_storage_ptr__,(long)(lVar9 + (uVar5 - 1)) / (long)uVar5,
               (long)((uVar5 - 1) + lVar13) / (long)uVar5,(long)iVar4);
    if (0 < image->depth) {
      uVar3 = (ulong)(uint)factor;
      lVar9 = 0;
      do {
        puVar10 = *__return_storage_ptr__->img[lVar9];
        lVar13 = image->height;
        if (lVar13 < (long)uVar5) {
          uVar11 = 0;
        }
        else {
          uVar6 = uVar5;
          uVar8 = 0;
          do {
            uVar11 = uVar6;
            lVar13 = image->width;
            if (factor == 2) {
              if (lVar13 < 2) goto LAB_00121c96;
              uVar6 = 0;
              do {
                puVar17 = image->img[lVar9][uVar8];
                *puVar10 = (uchar)((uint)puVar17[lVar13 + 1 + uVar6] +
                                   (uint)puVar17[lVar13 + uVar6] +
                                   (uint)puVar17[uVar6 + 1] + (uint)puVar17[uVar6] + 2 >> 2);
                puVar10 = puVar10 + 1;
                lVar13 = image->width;
                uVar15 = uVar6 + 2;
                lVar2 = uVar6 + 4;
                uVar6 = uVar15;
              } while (lVar2 <= lVar13);
            }
            else if (factor == 3) {
              if (lVar13 < 3) goto LAB_00121c96;
              lVar2 = 2;
              uVar6 = 3;
              do {
                uVar15 = uVar6;
                pbVar7 = image->img[lVar9][uVar8] + lVar2;
                iVar4 = 0;
                iVar14 = 3;
                do {
                  iVar4 = (uint)*pbVar7 + (uint)pbVar7[-1] + (uint)pbVar7[-2] + iVar4;
                  pbVar7 = pbVar7 + lVar13;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
                *puVar10 = (uchar)((iVar4 + 4U) / 9);
                puVar10 = puVar10 + 1;
                lVar13 = image->width;
                lVar2 = lVar2 + 3;
                uVar6 = uVar15 + 3;
              } while ((long)(uVar15 + 3) <= lVar13);
            }
            else if (factor == 4) {
              if (lVar13 < 4) {
LAB_00121c96:
                uVar15 = 0;
              }
              else {
                uVar6 = 4;
                uVar16 = 0;
                do {
                  uVar15 = uVar6;
                  puVar17 = image->img[lVar9][uVar8] + uVar16;
                  iVar14 = 0;
                  iVar4 = 4;
                  do {
                    uVar1 = *(undefined4 *)puVar17;
                    iVar14 = iVar14 + (uint)(ushort)((ushort)(byte)((uint)uVar1 >> 0x18) +
                                                     (ushort)(byte)((uint)uVar1 >> 8) +
                                                    (ushort)(byte)((uint)uVar1 >> 0x10) +
                                                    (ushort)(byte)uVar1);
                    puVar17 = puVar17 + lVar13;
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                  *puVar10 = (uchar)(iVar14 + 8U >> 4);
                  puVar10 = puVar10 + 1;
                  lVar13 = image->width;
                  uVar6 = uVar15 + 4;
                  uVar16 = uVar15;
                } while ((long)(uVar15 + 4) <= lVar13);
              }
            }
            else {
              if (lVar13 < (long)uVar5) goto LAB_00121c96;
              uVar6 = uVar5;
              uVar16 = 0;
              do {
                uVar15 = uVar6;
                puVar17 = image->img[lVar9][uVar8] + uVar16;
                iVar14 = 0;
                iVar4 = 0;
                do {
                  uVar6 = 0;
                  do {
                    iVar4 = iVar4 + (uint)puVar17[uVar6];
                    uVar6 = uVar6 + 1;
                  } while (uVar3 != uVar6);
                  puVar17 = puVar17 + lVar13;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != factor);
                *puVar10 = (uchar)((iVar4 + (factor * factor >> 1)) / (factor * factor));
                puVar10 = puVar10 + 1;
                lVar13 = image->width;
                uVar6 = uVar5 + uVar15;
                uVar16 = uVar15;
              } while ((long)(uVar5 + uVar15) <= lVar13);
            }
            lVar13 = image->width;
            if ((long)uVar15 < lVar13) {
              puVar17 = image->img[lVar9][uVar8] + uVar15;
              iVar4 = 0;
              iVar14 = 0;
              iVar12 = 0;
              do {
                uVar6 = 0;
                do {
                  if (lVar13 - uVar15 == uVar6) break;
                  iVar12 = iVar12 + (uint)puVar17[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar3 != uVar6);
                iVar14 = iVar14 + (int)uVar6;
                puVar17 = puVar17 + lVar13;
                iVar4 = iVar4 + 1;
              } while (iVar4 != factor);
              *puVar10 = (uchar)(((iVar14 >> 1) + iVar12) / iVar14);
              puVar10 = puVar10 + 1;
            }
            lVar13 = image->height;
            uVar6 = uVar11 + uVar5;
            uVar8 = uVar11;
          } while ((long)(uVar11 + uVar5) <= lVar13);
        }
        lVar2 = image->width;
        if (0 < lVar2 && (long)uVar11 < lVar13) {
          lVar13 = 0;
          do {
            puVar17 = image->img[lVar9][uVar11] + lVar13;
            uVar6 = 0;
            iVar14 = 0;
            iVar4 = 0;
            do {
              if (image->height <= (long)(uVar11 + uVar6)) break;
              uVar8 = 0;
              do {
                if (lVar2 <= (long)(lVar13 + uVar8)) break;
                iVar4 = iVar4 + (uint)puVar17[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
              iVar14 = iVar14 + (int)uVar8;
              puVar17 = puVar17 + lVar2;
              uVar6 = uVar6 + 1;
            } while (uVar6 != uVar3);
            *puVar10 = (uchar)(((iVar14 >> 1) + iVar4) / iVar14);
            puVar10 = puVar10 + 1;
            lVar13 = lVar13 + uVar5;
            lVar2 = image->width;
          } while (lVar13 < lVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < image->depth);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> downscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    T *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      if (factor == 2)
      {
        // speeding up special case of averaging over 2*2 pixels

        while (i+2 <= image.getWidth())
        {
          typename Image<T>::work_t v;

          const T *in=image.getPtr(i, k, d);

          v=*in+in[1];
          in+=image.getWidth();
          v+=*in+in[1];

          *out++=static_cast<typename Image<T>::store_t>((v+2)/4);
          i+=2;
        }
      }
      else if (factor == 3)
      {
        // speeding up special case of averaging over 3*3 pixels

        while (i+3 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<3; j++)
          {
            v+=*in+in[1]+in[2];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+4)/9);
          i+=3;
        }
      }
      else if (factor == 4)
      {
        // speeding up special case of averaging over 4*4 pixels

        while (i+4 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<4; j++)
          {
            v+=*in+in[1]+in[2]+in[3];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+8)/16);
          i+=4;
        }
      }
      else
      {
        // average over factor*factor pixels of the input image

        while (i+factor <= image.getWidth())
        {
          typename Image<T>::work_t v=0;
          int n=0;

          const T *in=image.getPtr(i, k, d);

          for (int kk=0; kk<factor; kk++)
          {
            for (int ii=0; ii<factor; ii++)
            {
              v+=in[ii];
              n++;
            }

            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
          i+=factor;
        }
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }
    }
  }

  return ret;
}